

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::FindBlockingModal(ImGuiWindow *window)

{
  ImGuiWindow *potential_parent;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *in_RDI;
  ImGuiWindow *parent;
  ImGuiWindow *popup_window;
  int i;
  ImGuiContext *g;
  ImGuiWindow *local_30;
  int local_1c;
  
  pIVar1 = GImGui;
  if (0 < (GImGui->OpenPopupStack).Size) {
    local_1c = (GImGui->OpenPopupStack).Size;
    while (local_1c = local_1c + -1, -1 < local_1c) {
      potential_parent = (pIVar1->OpenPopupStack).Data[local_1c].Window;
      if (((potential_parent != (ImGuiWindow *)0x0) && ((potential_parent->Flags & 0x8000000U) != 0)
          ) && (((potential_parent->Active & 1U) != 0 || ((potential_parent->WasActive & 1U) != 0)))
         ) {
        bVar2 = IsWindowWithinBeginStackOf(in_RDI,potential_parent);
        if (bVar2) {
          return (ImGuiWindow *)0x0;
        }
        for (local_30 = potential_parent->ParentWindowInBeginStack->RootWindow;
            local_30 != (ImGuiWindow *)0x0;
            local_30 = local_30->ParentWindowInBeginStack->RootWindow) {
          bVar2 = IsWindowWithinBeginStackOf(in_RDI,local_30);
          if (bVar2) {
            return potential_parent;
          }
        }
      }
    }
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* ImGui::FindBlockingModal(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= 0)
        return NULL;

    // Find a modal that has common parent with specified window. Specified window should be positioned behind that modal.
    for (int i = g.OpenPopupStack.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack.Data[i].Window;
        if (popup_window == NULL || !(popup_window->Flags & ImGuiWindowFlags_Modal))
            continue;
        if (!popup_window->Active && !popup_window->WasActive)      // Check WasActive, because this code may run before popup renders on current frame, also check Active to handle newly created windows.
            continue;
        if (IsWindowWithinBeginStackOf(window, popup_window))       // Window is rendered over last modal, no render order change needed.
            break;
        for (ImGuiWindow* parent = popup_window->ParentWindowInBeginStack->RootWindow; parent != NULL; parent = parent->ParentWindowInBeginStack->RootWindow)
            if (IsWindowWithinBeginStackOf(window, parent))
                return popup_window;                                // Place window above its begin stack parent.
    }
    return NULL;
}